

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O3

RenderContext *
glu::createRenderContext(Platform *platform,CommandLine *cmdLine,RenderConfig *config)

{
  int iVar1;
  SurfaceType SVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  ContextFactory *factory;
  FactoryBase *this_00;
  undefined4 extraout_var_00;
  NotSupportedError *pNVar5;
  long *plVar6;
  FboRenderContext *this_01;
  undefined4 extraout_var_01;
  long *plVar7;
  size_type *psVar8;
  size_t index;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  GenericFactoryRegistry *this;
  
  iVar1 = (*platform->_vptr_Platform[3])();
  this = (GenericFactoryRegistry *)CONCAT44(extraout_var,iVar1);
  pcVar3 = tcu::CommandLine::getGLContextType(cmdLine);
  if ((this->m_factories).
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_factories).
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"OpenGL is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0x8d);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (pcVar3 == (char *)0x0) {
    factory = (ContextFactory *)tcu::GenericFactoryRegistry::getFactoryByIndex(this,0);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar3,pcVar3 + sVar4);
    factory = (ContextFactory *)tcu::GenericFactoryRegistry::getFactoryByName(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (factory == (ContextFactory *)0x0) {
      tcu::print("ERROR: Unknown or unsupported GL context type \'%s\'\n",pcVar3);
      tcu::print("Supported GL context types:\n");
      if (0 < (int)((ulong)((long)(this->m_factories).
                                  super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_factories).
                                 super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        index = 0;
        do {
          this_00 = (FactoryBase *)tcu::GenericFactoryRegistry::getFactoryByIndex(this,index);
          iVar1 = (*(this_00->super_AbstractFactory)._vptr_AbstractFactory[2])(this_00);
          pcVar3 = tcu::FactoryBase::getDescription(this_00);
          tcu::print("  %s: %s\n",CONCAT44(extraout_var_00,iVar1),pcVar3);
          index = index + 1;
        } while ((long)index <
                 (long)(int)((ulong)((long)(this->m_factories).
                                           super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_factories).
                                          super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Unknown GL context type \'","");
      plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
      local_50 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_50 == plVar7) {
        local_40 = *plVar7;
        lStack_38 = plVar6[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar7;
      }
      local_48 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
        local_90.field_2._M_allocated_capacity = *psVar8;
        local_90.field_2._8_8_ = plVar6[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar8;
      }
      local_90._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,local_90._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0x9e);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  SVar2 = tcu::CommandLine::getSurfaceType(cmdLine);
  if (SVar2 == SURFACETYPE_FBO) {
    this_01 = (FboRenderContext *)operator_new(0x40);
    FboRenderContext::FboRenderContext(this_01,factory,config,cmdLine);
  }
  else {
    iVar1 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                      (factory,config,cmdLine);
    this_01 = (FboRenderContext *)CONCAT44(extraout_var_01,iVar1);
  }
  return &this_01->super_RenderContext;
}

Assistant:

RenderContext* createRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, const RenderConfig& config)
{
	const ContextFactoryRegistry&	registry		= platform.getGLPlatform().getContextFactoryRegistry();
	const char*						factoryName		= cmdLine.getGLContextType();
	const ContextFactory*			factory			= DE_NULL;

	if (registry.empty())
		throw tcu::NotSupportedError("OpenGL is not supported", DE_NULL, __FILE__, __LINE__);

	if (factoryName)
	{
		factory = registry.getFactoryByName(factoryName);

		if (!factory)
		{
			tcu::print("ERROR: Unknown or unsupported GL context type '%s'\n", factoryName);
			tcu::print("Supported GL context types:\n");

			for (int factoryNdx = 0; factoryNdx < (int)registry.getFactoryCount(); factoryNdx++)
			{
				const ContextFactory* curFactory = registry.getFactoryByIndex(factoryNdx);
				tcu::print("  %s: %s\n", curFactory->getName(), curFactory->getDescription());
			}

			throw tcu::NotSupportedError((std::string("Unknown GL context type '") + factoryName + "'").c_str(), DE_NULL, __FILE__, __LINE__);
		}
	}
	else
		factory = registry.getDefaultFactory();

	if (cmdLine.getSurfaceType() == tcu::SURFACETYPE_FBO)
		return new FboRenderContext(*factory, config, cmdLine);
	else
		return factory->createContext(config, cmdLine);
}